

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

ssize_t __thiscall r_comp::Compiler::read(Compiler *this,int __fd,void *__buf,size_t __nbytes)

{
  Iteration IVar1;
  uint uVar2;
  Class *pCVar3;
  code *pcVar4;
  Class *__nbytes_00;
  void *extraout_RDX;
  void *__buf_00;
  long extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *__buf_01;
  long extraout_RDX_03;
  ulong uVar5;
  int __fd_00;
  undefined4 in_register_00000034;
  undefined8 *puVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined2 in_R8W;
  ulong in_R9;
  undefined1 in_stack_00000008;
  undefined1 local_58;
  undefined8 local_50;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_48;
  undefined8 local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  Metadata *metadata;
  
  puVar6 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  metadata = this->_metadata;
  __nbytes_00 = (Class *)__nbytes;
  pCVar3 = StructureMember::get_class((StructureMember *)__buf,metadata);
  __fd_00 = (int)metadata;
  local_58 = (undefined1)__nbytes;
  __buf_01 = extraout_RDX;
  uVar5 = in_R9;
  if (pCVar3 != (Class *)0x0) {
    IVar1 = StructureMember::getIteration((StructureMember *)__buf);
    pCVar3->use_as = IVar1;
    pcVar4 = (code *)StructureMember::read
                               ((StructureMember *)__buf,__fd_00,__buf_00,(size_t)__nbytes_00);
    plVar8 = (long *)((long)&(this->error)._M_dataplus._M_p + extraout_RDX_00);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar8 + -1);
    }
    local_40 = *puVar6;
    local_38 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_38->_M_use_count = local_38->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_38->_M_use_count = local_38->_M_use_count + 1;
      }
    }
    puVar7 = &local_40;
    __nbytes_00 = pCVar3;
    uVar2 = (*pcVar4)(plVar8,puVar7,local_58,pCVar3,in_R8W);
    __fd_00 = (int)puVar7;
    __buf_01 = extraout_RDX_01;
    uVar5 = (ulong)uVar2;
    if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
      __buf_01 = extraout_RDX_02;
    }
  }
  if (pCVar3 == (Class *)0x0) {
    pcVar4 = (code *)StructureMember::read
                               ((StructureMember *)__buf,__fd_00,__buf_01,(size_t)__nbytes_00);
    plVar8 = (long *)((long)&(this->error)._M_dataplus._M_p + extraout_RDX_03);
    if (((ulong)pcVar4 & 1) != 0) {
      pcVar4 = *(code **)(pcVar4 + *plVar8 + -1);
    }
    local_50 = *puVar6;
    local_48 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)puVar6[1];
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_48->_M_use_count = local_48->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_48->_M_use_count = local_48->_M_use_count + 1;
      }
    }
    uVar2 = (*pcVar4)(plVar8,&local_50,local_58,0,in_R8W,in_R9,in_stack_00000008);
    uVar5 = (ulong)uVar2;
    if (local_48 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_48);
    }
  }
  return uVar5 & 0xffffff01;
}

Assistant:

bool Compiler::read(RepliStruct::Ptr node, const StructureMember &m, bool enforce, uint16_t write_index, uint16_t &extent_index, bool write)
{
    if (Class *p = m.get_class(_metadata)) {
        p->use_as = m.getIteration();
        return (this->*m.read())(node, enforce, p, write_index, extent_index, write);
    }

    return (this->*m.read())(node, enforce, nullptr, write_index, extent_index, write);
}